

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d63_qx_inside_interval.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  _Self __tmp;
  istream *piVar2;
  mapped_type *pmVar3;
  iterator iVar4;
  ostream *poVar5;
  bool bVar6;
  int a;
  int b;
  int n;
  int m;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> d;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105190) = 0;
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&m);
  std::istream::operator>>(piVar2,&n);
  d._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &d._M_t._M_impl.super__Rb_tree_header._M_header;
  d._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  d._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  d._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  d._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       d._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (bVar6 = m != 0, m = m + -1, bVar6) {
    piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&a);
    std::istream::operator>>(piVar2,&b);
    iVar1 = b;
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&d,&a);
    *pmVar3 = iVar1;
  }
LAB_00101359:
  bVar6 = n == 0;
  n = n + -1;
  if (bVar6) {
    std::operator<<((ostream *)&std::cout,"\n");
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&d._M_t);
    return 0;
  }
  std::istream::operator>>((istream *)&std::cin,&a);
  iVar4 = std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::lower_bound(&d._M_t,&a);
  if (iVar4._M_node[1]._M_color != a) goto LAB_0010138e;
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
  goto LAB_001013c4;
LAB_0010138e:
  if ((_Rb_tree_header *)iVar4._M_node == &d._M_t._M_impl.super__Rb_tree_header ||
      a < (int)iVar4._M_node[1]._M_color) {
    std::_Rb_tree_decrement(iVar4._M_node);
    poVar5 = std::ostream::_M_insert<bool>(true);
LAB_001013c4:
    std::operator<<(poVar5," ");
  }
  goto LAB_00101359;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);

    int m, n;
    cin >> m >> n;
    map<int, int> d;

    while (m--) {
        int a, b;
        cin >> a >> b;

        d[a] = b;
    }

    while (n--) {
        int x;
        cin >> x;
        auto it = d.lower_bound(x);
        if (it->first == x) {
            cout << 1 << " ";
        } else if (it == d.end() || it->first > x) {
            it--;
            cout << check_range(it, x) << " ";
        }
    }
    cout << "\n";
}